

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::decode(jpeg_decoder *this,void **pScan_line,uint *pScan_line_len)

{
  bool bVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  int status;
  bool got_mcu_early;
  bool get_another_mcu_row;
  bool chroma_y_filtering;
  uint *pScan_line_len_local;
  void **pScan_line_local;
  jpeg_decoder *this_local;
  
  if ((this->m_error_code == JPGD_SUCCESS) && ((this->m_ready_flag & 1U) != 0)) {
    if (this->m_total_lines_left == 0) {
      this_local._4_4_ = 1;
    }
    else {
      bVar3 = false;
      if (((this->m_flags & 1) == 0) && (bVar3 = true, this->m_scan_type != 4)) {
        bVar3 = this->m_scan_type == 3;
      }
      bVar4 = false;
      bVar1 = false;
      if (bVar3) {
        if (this->m_total_lines_left == this->m_image_y_size) {
          bVar4 = true;
        }
        else if ((this->m_mcu_lines_left == 1) && (1 < this->m_total_lines_left)) {
          bVar4 = true;
          bVar1 = true;
        }
      }
      else {
        bVar4 = this->m_mcu_lines_left == 0;
      }
      if ((!bVar4) || (this_local._4_4_ = decode_next_mcu_row(this), this_local._4_4_ == 0)) {
        switch(this->m_scan_type) {
        case 0:
          gray_convert(this);
          *pScan_line = this->m_pScan_line_0;
          break;
        case 1:
          H1V1Convert(this);
          *pScan_line = this->m_pScan_line_0;
          break;
        case 2:
          if ((this->m_flags & 1) == 0) {
            H2V1ConvertFiltered(this);
          }
          else {
            H2V1Convert(this);
          }
          *pScan_line = this->m_pScan_line_0;
          break;
        case 3:
          if (bVar3) {
            H1V2ConvertFiltered(this);
            *pScan_line = this->m_pScan_line_0;
          }
          else if ((this->m_mcu_lines_left & 1U) == 0) {
            H1V2Convert(this);
            *pScan_line = this->m_pScan_line_0;
          }
          else {
            *pScan_line = this->m_pScan_line_1;
          }
          break;
        case 4:
          if ((this->m_flags & 1) == 0) {
            if (this->m_num_buffered_scanlines == 1) {
              *pScan_line = this->m_pScan_line_1;
            }
            else if (this->m_num_buffered_scanlines == 0) {
              uVar2 = H2V2ConvertFiltered(this);
              this->m_num_buffered_scanlines = uVar2;
              *pScan_line = this->m_pScan_line_0;
            }
            this->m_num_buffered_scanlines = this->m_num_buffered_scanlines + -1;
          }
          else if ((this->m_mcu_lines_left & 1U) == 0) {
            H2V2Convert(this);
            *pScan_line = this->m_pScan_line_0;
          }
          else {
            *pScan_line = this->m_pScan_line_1;
          }
        }
        *pScan_line_len = this->m_real_dest_bytes_per_scan_line;
        if (!bVar1) {
          this->m_mcu_lines_left = this->m_mcu_lines_left + -1;
        }
        this->m_total_lines_left = this->m_total_lines_left + -1;
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int jpeg_decoder::decode(const void** pScan_line, uint* pScan_line_len)
	{
		if ((m_error_code) || (!m_ready_flag))
			return JPGD_FAILED;

		if (m_total_lines_left == 0)
			return JPGD_DONE;

		const bool chroma_y_filtering = ((m_flags & cFlagBoxChromaFiltering) == 0) && ((m_scan_type == JPGD_YH2V2) || (m_scan_type == JPGD_YH1V2));

		bool get_another_mcu_row = false;
		bool got_mcu_early = false;
		if (chroma_y_filtering)
		{
			if (m_total_lines_left == m_image_y_size)
				get_another_mcu_row = true;
			else if ((m_mcu_lines_left == 1) && (m_total_lines_left > 1))
			{
				get_another_mcu_row = true;
				got_mcu_early = true;
			}
		}
		else
		{
			get_another_mcu_row = (m_mcu_lines_left == 0);
		}

		if (get_another_mcu_row)
		{
			int status = decode_next_mcu_row();
			if (status != 0)
				return status;
		}

		switch (m_scan_type)
		{
		case JPGD_YH2V2:
		{
			if ((m_flags & cFlagBoxChromaFiltering) == 0)
			{
				if (m_num_buffered_scanlines == 1)
				{
					*pScan_line = m_pScan_line_1;
				}
				else if (m_num_buffered_scanlines == 0)
				{
					m_num_buffered_scanlines = H2V2ConvertFiltered();
					*pScan_line = m_pScan_line_0;
				}

				m_num_buffered_scanlines--;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H2V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH2V1:
		{
			if ((m_flags & cFlagBoxChromaFiltering) == 0)
				H2V1ConvertFiltered();
			else
				H2V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_YH1V2:
		{
			if (chroma_y_filtering)
			{
				H1V2ConvertFiltered();
				*pScan_line = m_pScan_line_0;
			}
			else
			{
				if ((m_mcu_lines_left & 1) == 0)
				{
					H1V2Convert();
					*pScan_line = m_pScan_line_0;
				}
				else
					*pScan_line = m_pScan_line_1;
			}

			break;
		}
		case JPGD_YH1V1:
		{
			H1V1Convert();
			*pScan_line = m_pScan_line_0;
			break;
		}
		case JPGD_GRAYSCALE:
		{
			gray_convert();
			*pScan_line = m_pScan_line_0;

			break;
		}
		}

		*pScan_line_len = m_real_dest_bytes_per_scan_line;

		if (!got_mcu_early)
		{
			m_mcu_lines_left--;
		}

		m_total_lines_left--;

		return JPGD_SUCCESS;
	}